

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlnumber.c
# Opt level: O2

err_t RenderDataFloat(ebml_float *Element,stream *Output,bool_t bForceWithoutMandatory,
                     bool_t bWithDefault,int ForProfile,filepos_t *Rendered)

{
  double dVar1;
  err_t eVar2;
  void *pvVar3;
  float fVar4;
  undefined8 uStack_20;
  uint64_t Buf;
  size_t i;
  
  i = 0;
  if ((Element->Base).DataSize == 8) {
    dVar1 = Element->Value;
    Buf = (ulong)dVar1 >> 0x38 | ((ulong)dVar1 & 0xff000000000000) >> 0x28 |
          ((ulong)dVar1 & 0xff0000000000) >> 0x18 | ((ulong)dVar1 & 0xff00000000) >> 8 |
          ((ulong)dVar1 & 0xff000000) << 8 | ((ulong)dVar1 & 0xff0000) << 0x18 |
          ((ulong)dVar1 & 0xff00) << 0x28 | (long)dVar1 << 0x38;
    if (Output == (stream *)0x0) {
      __assert_fail("(const void*)(Output)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlnumber.c"
                    ,0xb0,
                    "err_t RenderDataFloat(ebml_float *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                   );
    }
    pvVar3 = (Output->Base).VMT;
    uStack_20 = 8;
  }
  else {
    fVar4 = (float)Element->Value;
    Buf = CONCAT44(Buf._4_4_,
                   (uint)fVar4 >> 0x18 | ((uint)fVar4 & 0xff0000) >> 8 | ((uint)fVar4 & 0xff00) << 8
                   | (int)fVar4 << 0x18);
    if (Output == (stream *)0x0) {
      __assert_fail("(const void*)(Output)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlnumber.c"
                    ,0xbb,
                    "err_t RenderDataFloat(ebml_float *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                   );
    }
    pvVar3 = (Output->Base).VMT;
    uStack_20 = 4;
  }
  eVar2 = (**(code **)((long)pvVar3 + 0x70))(Output,&Buf,uStack_20,&i);
  if (Rendered != (filepos_t *)0x0) {
    *Rendered = i;
  }
  return eVar2;
}

Assistant:

static err_t RenderDataFloat(ebml_float *Element, struct stream *Output, bool_t UNUSED_PARAM(bForceWithoutMandatory), bool_t UNUSED_PARAM(bWithDefault), int UNUSED_PARAM(ForProfile), filepos_t *Rendered)
{
    err_t Err;
    size_t i = 0;
    if (Element->Base.DataSize == 8)
    {
        union {
            uint32_t i;
            double f;
        } data;
        uint64_t Buf;
        data.f = Element->Value;
        Buf = LOAD64BE(&data.i);
        Err = Stream_Write(Output,&Buf,8,&i);
    }
    else
    {
        union {
            uint32_t i;
            float f;
        } data;
        uint32_t Buf;
        data.f = (float)Element->Value;
        Buf = LOAD32BE(&data.i);
        Err = Stream_Write(Output,&Buf,4,&i);
    }
    if (Rendered)
        *Rendered = i;
    return Err;
}